

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O1

bool __thiscall
Diligent::DearchiverBase::UnpackPSOShaders<Diligent::GraphicsPipelineStateCreateInfo>
          (DearchiverBase *this,ArchiveData *Archive,
          PSOData<Diligent::GraphicsPipelineStateCreateInfo> *PSO,IRenderDevice *pDevice)

{
  pointer pRVar1;
  pointer pRVar2;
  mutex *pmVar3;
  bool bVar4;
  DeviceType DevType;
  SerializedData *pSVar5;
  char (*Args_1) [20];
  ulong Idx;
  ulong uVar6;
  long lVar7;
  int iVar8;
  Serializer<(Diligent::SerializerMode)0> Ser;
  ShaderIndexArray ShaderIndices;
  string msg;
  Serializer<(Diligent::SerializerMode)0> ShaderSer;
  DynamicLinearAllocator Allocator;
  string local_180;
  vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  *local_160;
  ArchiveData *local_158;
  mutex *local_150;
  ConstQual<ShaderIndexArray> local_148;
  undefined1 local_138 [32];
  anon_union_8_2_8aa5a88c_for_ShaderCreateInfo_4 local_118;
  char *local_110;
  ShaderMacro *local_108;
  Uint32 local_100;
  DeviceObjectAttribs local_f8;
  SHADER_TYPE local_f0;
  Bool local_ec;
  char *local_e8;
  undefined8 local_e0;
  ShaderVersion SStack_d8;
  ShaderVersion SStack_d0;
  ShaderVersion SStack_c8;
  undefined1 auStack_c0 [5];
  ulong uStack_bb;
  char *local_b0;
  char *pcStack_a8;
  DearchiverBase *local_98;
  PSOData<Diligent::GraphicsPipelineStateCreateInfo> *local_90;
  IRenderDevice *local_88;
  vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  *local_80;
  RefCntAutoPtr<Diligent::IShader> *local_78;
  Serializer<(Diligent::SerializerMode)0> local_70;
  DynamicLinearAllocator local_58;
  
  if ((Archive->pObjArchive)._M_t.
      super___uniq_ptr_impl<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_Diligent::DeviceObjectArchive_*,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
      .super__Head_base<0UL,_const_Diligent::DeviceObjectArchive_*,_false>._M_head_impl ==
      (DeviceObjectArchive *)0x0) {
    FormatString<char[26],char[12]>
              ((string *)local_138,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pObjArchive",(char (*) [12])pDevice);
    DebugAssertionFailed
              ((Char *)local_138._0_8_,"UnpackPSOShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x19d);
    if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
  }
  DevType = GetArchiveDeviceType(pDevice);
  pSVar5 = DeviceObjectArchive::GetDeviceSpecificData
                     ((Archive->pObjArchive)._M_t.
                      super___uniq_ptr_impl<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_const_Diligent::DeviceObjectArchive_*,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                      .super__Head_base<0UL,_const_Diligent::DeviceObjectArchive_*,_false>.
                      _M_head_impl,GraphicsPipeline,
                      (PSO->CreateInfo).super_PipelineStateCreateInfo.PSODesc.
                      super_DeviceObjectAttribs.Name,DevType);
  if (pSVar5->m_Ptr == (void *)0x0) {
    return false;
  }
  local_58.m_pAllocator = GetRawAllocator();
  local_58.m_Blocks.
  super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.m_Blocks.
  super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.m_Blocks.
  super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.m_BlockSize = 0x1000;
  local_148.pIndices = (Uint32 *)0x0;
  local_148.Count = 0;
  local_180._M_dataplus._M_p = (pointer)pSVar5->m_Ptr;
  local_180._M_string_length = pSVar5->m_Size + (long)local_180._M_dataplus._M_p;
  local_180.field_2._M_allocated_capacity = (size_type)local_180._M_dataplus._M_p;
  bVar4 = PSOSerializer<(Diligent::SerializerMode)0>::SerializeShaderIndices
                    ((Serializer<(Diligent::SerializerMode)0> *)&local_180,&local_148,&local_58);
  if (bVar4) {
    if (local_180.field_2._M_allocated_capacity == local_180._M_string_length) goto LAB_0025ba8e;
    FormatString<char[49]>
              ((string *)local_138,(char (*) [49])"No other data besides shader indices is expected"
              );
    DebugAssertionFailed
              ((Char *)local_138._0_8_,"UnpackPSOShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x1ad);
  }
  else {
    FormatString<char[84]>
              ((string *)local_138,
               (char (*) [84])
               "Failed to deserialize PSO shader indices. Archive file may be corrupted or invalid."
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,local_138._0_8_,0,0,0);
    }
  }
  if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
  }
LAB_0025ba8e:
  if (bVar4) {
    local_80 = &PSO->Shaders;
    local_158 = Archive;
    local_98 = this;
    local_90 = PSO;
    local_88 = pDevice;
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
    ::resize(local_80,(ulong)local_148.Count);
    bVar4 = local_148.Count == 0;
    if (!bVar4) {
      local_150 = &(local_158->CachedShaders)._M_elems[DevType].Mtx;
      local_160 = &(local_158->CachedShaders)._M_elems[DevType].Shaders;
      lVar7 = 0;
      uVar6 = 0;
      do {
        pmVar3 = local_150;
        pRVar1 = (local_80->
                 super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        Idx = (ulong)local_148.pIndices[uVar6];
        local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
        local_138._0_8_ = local_150;
        std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_138);
        local_78 = (RefCntAutoPtr<Diligent::IShader> *)((long)&pRVar1->m_pObject + lVar7);
        local_138[8] = 1;
        pRVar2 = (((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                    *)(pmVar3 + 1))->
                 super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((Idx < (ulong)((long)(((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                                    *)(pmVar3 + 1))->
                                 super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar2 >> 3))
           && (RefCntAutoPtr<Diligent::IShader>::operator=(local_78,pRVar2[Idx].m_pObject),
              pRVar1[uVar6].m_pObject != (IShader *)0x0)) {
          iVar8 = 0xe;
          bVar4 = false;
        }
        else {
          iVar8 = 0;
          bVar4 = true;
        }
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_138);
        if (bVar4) {
          pSVar5 = DeviceObjectArchive::GetSerializedShader
                             ((local_158->pObjArchive)._M_t.
                              super___uniq_ptr_impl<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_const_Diligent::DeviceObjectArchive_*,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                              .super__Head_base<0UL,_const_Diligent::DeviceObjectArchive_*,_false>.
                              _M_head_impl,DevType,Idx);
          iVar8 = 1;
          if (pSVar5->m_Ptr != (void *)0x0) {
            local_138._16_8_ = 0;
            local_138._24_8_ = 0;
            local_138._0_8_ = (mutex *)0x0;
            local_138._8_8_ = (IShaderSourceInputStreamFactory *)0x0;
            local_118.SourceLength = 0;
            local_110 = "main";
            local_108 = (ShaderMacro *)0x0;
            local_100 = 0;
            local_f8.Name = (Char *)0x0;
            local_f0 = SHADER_TYPE_UNKNOWN;
            local_ec = false;
            local_e8 = "_sampler";
            auStack_c0 = (undefined1  [5])0x0;
            uStack_bb = 0;
            SStack_d0.Major = 0;
            SStack_d0.Minor = 0;
            SStack_c8._0_5_ = 0;
            SStack_c8.Minor._1_3_ = 0;
            local_e0._0_4_ = SHADER_SOURCE_LANGUAGE_DEFAULT;
            local_e0._4_4_ = SHADER_COMPILER_DEFAULT;
            SStack_d8.Major = 0;
            SStack_d8.Minor = 0;
            local_b0 = (char *)0x0;
            pcStack_a8 = (char *)0x0;
            Args_1 = (char (*) [20])pSVar5->m_Ptr;
            local_70.m_End = (TPointer)(*Args_1 + pSVar5->m_Size);
            local_70.m_Start = (TPointer)Args_1;
            local_70.m_Ptr = (TPointer)Args_1;
            bVar4 = ShaderSerializer<(Diligent::SerializerMode)0>::SerializeCI
                              (&local_70,(ConstQual<ShaderCreateInfo> *)local_138);
            if (bVar4) {
              if (local_70.m_Ptr != local_70.m_End) {
                FormatString<char[26],char[20]>
                          (&local_180,(Diligent *)"Debug expression failed:\n",
                           (char (*) [26])"ShaderSer.IsEnded()",Args_1);
                DebugAssertionFailed
                          (local_180._M_dataplus._M_p,"UnpackPSOShaders",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
                           ,0x1d1);
                goto LAB_0025bccc;
              }
            }
            else {
              FormatString<char[84]>
                        (&local_180,
                         (char (*) [84])
                         "Failed to deserialize shader create info. Archive file may be corrupted or invalid."
                        );
              if (DebugMessageCallback != (undefined *)0x0) {
                (*(code *)DebugMessageCallback)(2,local_180._M_dataplus._M_p,0,0,0);
              }
LAB_0025bccc:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
            }
            if (bVar4) {
              if (((local_90->InternalCI).Flags & PSO_CREATE_INTERNAL_FLAG_LAST) !=
                  PSO_CREATE_INTERNAL_FLAG_NONE) {
                uStack_bb = uStack_bb | 0x2000000;
              }
              (*(local_98->super_ObjectBase<Diligent::IDearchiver>).
                super_RefCountedObject<Diligent::IDearchiver>.super_IDearchiver.super_IObject.
                _vptr_IObject[0xf])(&local_180,local_98,local_138,local_88);
              RefCntAutoPtr<Diligent::IShader>::operator=
                        (local_78,(RefCntAutoPtr<Diligent::IShader> *)&local_180);
              if ((long *)local_180._M_dataplus._M_p != (long *)0x0) {
                (**(code **)(*(long *)local_180._M_dataplus._M_p + 0x10))();
                local_180._M_dataplus._M_p = (pointer)0x0;
              }
              pmVar3 = local_150;
              if (pRVar1[uVar6].m_pObject != (IShader *)0x0) {
                local_138._0_8_ = local_150;
                local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
                std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_138);
                local_138[8] = 1;
                if ((ulong)((long)(((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                                     *)(pmVar3 + 1))->
                                  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                                     *)(pmVar3 + 1))->
                                  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 3) <= Idx) {
                  std::
                  vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                  ::resize(local_160,Idx + 1);
                }
                RefCntAutoPtr<Diligent::IShader>::operator=
                          ((local_160->
                           super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + Idx,pRVar1[uVar6].m_pObject)
                ;
                std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_138);
                iVar8 = 0;
              }
            }
          }
        }
        if ((iVar8 != 0xe) && (iVar8 != 0)) goto LAB_0025bde8;
        uVar6 = uVar6 + 1;
        lVar7 = lVar7 + 8;
        bVar4 = uVar6 >= local_148.Count;
      } while (uVar6 < local_148.Count);
    }
  }
  else {
LAB_0025bde8:
    bVar4 = false;
  }
  DynamicLinearAllocator::~DynamicLinearAllocator(&local_58);
  return bVar4;
}

Assistant:

bool DearchiverBase::UnpackPSOShaders(ArchiveData&             Archive,
                                      PSOData<CreateInfoType>& PSO,
                                      IRenderDevice*           pDevice)
{
    const auto& pObjArchive = Archive.pObjArchive;
    VERIFY_EXPR(pObjArchive);
    const DeviceType      DevType       = GetArchiveDeviceType(pDevice);
    const SerializedData& ShaderIdxData = pObjArchive->GetDeviceSpecificData(PSO.ArchiveResType, PSO.CreateInfo.PSODesc.Name, DevType);
    if (!ShaderIdxData)
        return false;

    DynamicLinearAllocator Allocator{GetRawAllocator()};

    DeviceObjectArchive::ShaderIndexArray ShaderIndices;
    {
        Serializer<SerializerMode::Read> Ser{ShaderIdxData};
        if (!PSOSerializer<SerializerMode::Read>::SerializeShaderIndices(Ser, ShaderIndices, &Allocator))
        {
            LOG_ERROR_MESSAGE("Failed to deserialize PSO shader indices. Archive file may be corrupted or invalid.");
            return false;
        }
        VERIFY(Ser.IsEnded(), "No other data besides shader indices is expected");
    }

    ShaderCacheData& ShaderCache = Archive.CachedShaders[static_cast<size_t>(DevType)];

    PSO.Shaders.resize(ShaderIndices.Count);
    for (Uint32 i = 0; i < ShaderIndices.Count; ++i)
    {
        RefCntAutoPtr<IShader>& pShader{PSO.Shaders[i]};

        const Uint32 Idx = ShaderIndices.pIndices[i];

        {
            std::unique_lock<std::mutex> ReadLock{ShaderCache.Mtx};
            if (Idx < ShaderCache.Shaders.size())
            {
                // Try to get cached shader
                pShader = ShaderCache.Shaders[Idx];
                if (pShader)
                    continue;
            }
        }

        const SerializedData& SerializedShader = pObjArchive->GetSerializedShader(DevType, Idx);
        if (!SerializedShader)
            return false;

        {
            ShaderCreateInfo ShaderCI;
            {
                Serializer<SerializerMode::Read> ShaderSer{SerializedShader};
                if (!ShaderSerializer<SerializerMode::Read>::SerializeCI(ShaderSer, ShaderCI))
                {
                    LOG_ERROR_MESSAGE("Failed to deserialize shader create info. Archive file may be corrupted or invalid.");
                    return false;
                }
                VERIFY_EXPR(ShaderSer.IsEnded());
            }

            if ((PSO.InternalCI.Flags & PSO_CREATE_INTERNAL_FLAG_NO_SHADER_REFLECTION) != 0)
                ShaderCI.CompileFlags |= SHADER_COMPILE_FLAG_SKIP_REFLECTION;

            pShader = UnpackShader(ShaderCI, pDevice);
            if (!pShader)
                return false;
        }

        // Add to the cache
        {
            std::unique_lock<std::mutex> WriteLock{ShaderCache.Mtx};
            if (Idx >= ShaderCache.Shaders.size())
                ShaderCache.Shaders.resize(size_t{Idx} + 1);
            ShaderCache.Shaders[Idx] = pShader;
        }
    }

    return true;
}